

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition.c
# Opt level: O0

hd_part * hd_open_part(hd_context *ctx,hd_disk *disk,char *partname)

{
  hd_part_handler_context *phVar1;
  hd_part *phVar2;
  hd_part *part;
  int rc;
  hd_part_handler_context *ph;
  int i;
  char *partname_local;
  hd_disk *disk_local;
  hd_context *ctx_local;
  
  if (partname == (char *)0x0) {
    hd_throw(ctx,2,"no part to open");
  }
  phVar1 = ctx->part;
  if (phVar1->count == 0) {
    hd_throw(ctx,2,"No part handlers registered");
  }
  ph._4_4_ = 0;
  while( true ) {
    if (phVar1->count <= ph._4_4_) {
      hd_throw(ctx,2,"Could not find the specified part handler");
    }
    part._4_4_ = 0;
    phVar2 = (*phVar1->handler[ph._4_4_]->open)(ctx,disk,partname);
    phVar2->name = partname;
    if (phVar2->probe_part != (hd_part_probe_fn *)0x0) {
      part._4_4_ = (*phVar2->probe_part)(ctx,disk,phVar2);
    }
    if (part._4_4_ == 1) break;
    hd_drop_disk(ctx,disk);
    ph._4_4_ = ph._4_4_ + 1;
  }
  return phVar2;
}

Assistant:

hd_part *
hd_open_part(hd_context *ctx, hd_disk *disk, const char *partname)
{
    int i;
    hd_part_handler_context *ph;

    if (partname == NULL)
        hd_throw(ctx, HD_ERROR_GENERIC, "no part to open");

    ph = ctx->part;
    if (ph->count == 0)
        hd_throw(ctx, HD_ERROR_GENERIC, "No part handlers registered");

    for (i = 0; i < ph->count; i++)
    {
        int rc = 0;
        hd_part *part;
        part = ph->handler[i]->open(ctx, disk, partname);
        part->name = partname;
        if (part->probe_part)
            rc = part->probe_part(ctx, disk, part);


        if(rc != 1)
        {
            hd_drop_disk(ctx, disk);
            continue;
        }

        return part;
    }

    hd_throw(ctx, HD_ERROR_GENERIC, "Could not find the specified part handler");
}